

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

void BZ2_bzReadGetUnused(int *bzerror,BZFILE *b,void **unused,int *nUnused)

{
  bzFile *bzf;
  int *nUnused_local;
  void **unused_local;
  BZFILE *b_local;
  int *bzerror_local;
  
  if (b == (BZFILE *)0x0) {
    if (bzerror != (int *)0x0) {
      *bzerror = -2;
    }
  }
  else if (*(int *)((long)b + 0x13e8) == 4) {
    if ((unused == (void **)0x0) || (nUnused == (int *)0x0)) {
      if (bzerror != (int *)0x0) {
        *bzerror = -2;
      }
      if (b != (BZFILE *)0x0) {
        *(undefined4 *)((long)b + 0x13e8) = 0xfffffffe;
      }
    }
    else {
      if (bzerror != (int *)0x0) {
        *bzerror = 0;
      }
      if (b != (BZFILE *)0x0) {
        *(undefined4 *)((long)b + 0x13e8) = 0;
      }
      *nUnused = *(int *)((long)b + 0x13a0);
      *unused = *(void **)((long)b + 0x1398);
    }
  }
  else {
    if (bzerror != (int *)0x0) {
      *bzerror = -1;
    }
    if (b != (BZFILE *)0x0) {
      *(undefined4 *)((long)b + 0x13e8) = 0xffffffff;
    }
  }
  return;
}

Assistant:

void BZ_API(BZ2_bzReadGetUnused)
                     ( int*    bzerror,
                       BZFILE* b,
                       void**  unused,
                       int*    nUnused )
{
   bzFile* bzf = (bzFile*)b;
   if (bzf == NULL)
      { BZ_SETERR(BZ_PARAM_ERROR); return; };
   if (bzf->lastErr != BZ_STREAM_END)
      { BZ_SETERR(BZ_SEQUENCE_ERROR); return; };
   if (unused == NULL || nUnused == NULL)
      { BZ_SETERR(BZ_PARAM_ERROR); return; };

   BZ_SETERR(BZ_OK);
   *nUnused = bzf->strm.avail_in;
   *unused = bzf->strm.next_in;
}